

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O0

ErrorGenerator * JsonErrors::EXPECTED_TYPE(ErrorGenerator *__return_storage_ptr__,string *type)

{
  string local_38 [32];
  string *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)type);
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<JsonErrors::EXPECTED_TYPE(std::__cxx11::string_const&)::__0,void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             (anon_class_32_1_89923c38 *)local_38);
  EXPECTED_TYPE(std::__cxx11::string_const&)::$_0::~__0((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator EXPECTED_TYPE(const std::string& type)
{
  return [type](const Json::Value* value, cmJSONState* state) -> void {
    if (state->key().empty()) {
      state->AddErrorAtValue(cmStrCat("Expected ", type), value);
      return;
    }
    std::string errMsg = cmStrCat("\"", state->key(), "\" expected ", type);
    if (value && value->isConvertibleTo(Json::ValueType::stringValue)) {
      errMsg = cmStrCat(errMsg, ", got: ", value->asString());
    }
    state->AddErrorAtValue(errMsg, value);
  };
}